

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O0

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_integral_of_landscape
          (Persistence_landscape_on_grid *this)

{
  size_t sVar1;
  double dVar2;
  undefined8 local_28;
  size_t i;
  double result;
  size_t maximal_level;
  Persistence_landscape_on_grid *this_local;
  
  sVar1 = number_of_nonzero_levels(this);
  i = 0;
  for (local_28 = 0; local_28 != sVar1; local_28 = local_28 + 1) {
    dVar2 = compute_integral_of_landscape(this,local_28);
    i = (size_t)(dVar2 + (double)i);
  }
  return (double)i;
}

Assistant:

double compute_integral_of_landscape() const {
    size_t maximal_level = this->number_of_nonzero_levels();
    double result = 0;
    for (size_t i = 0; i != maximal_level; ++i) {
      result += this->compute_integral_of_landscape(i);
    }
    return result;
  }